

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPointSizeTests.cpp
# Opt level: O0

TestStatus *
vkt::tessellation::anon_unknown_1::test
          (TestStatus *__return_storage_ptr__,Context *context,Flags flags)

{
  deUint32 *this;
  VkRenderPass VVar1;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer commandBuffer;
  VkCommandBuffer_s *pVVar2;
  deUint64 dVar3;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  RefData<vk::Handle<(vk::HandleType)13>_> data;
  RefData<vk::Handle<(vk::HandleType)17>_> data_00;
  RefData<vk::Handle<(vk::HandleType)23>_> data_01;
  RefData<vk::Handle<(vk::HandleType)16>_> data_02;
  RefData<vk::Handle<(vk::HandleType)24>_> data_03;
  RefData<vk::VkCommandBuffer_s_*> data_04;
  RefData<vk::Handle<(vk::HandleType)18>_> data_05;
  bool bVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  deUint32 dVar9;
  deUint32 height;
  TestContext *pTVar10;
  MessageBuilder *pMVar11;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Allocator *allocator_00;
  VkDeviceSize bufferSize;
  VkImage *pVVar12;
  Handle<(vk::HandleType)17> *pHVar13;
  Handle<(vk::HandleType)13> *pHVar14;
  Handle<(vk::HandleType)24> *pHVar15;
  GraphicsPipelineBuilder *pGVar16;
  ProgramCollection<vk::ProgramBinary> *pPVar17;
  ProgramBinary *pPVar18;
  Handle<(vk::HandleType)16> *pHVar19;
  VkCommandBuffer_s **ppVVar20;
  Handle<(vk::HandleType)23> *pHVar21;
  Handle<(vk::HandleType)18> *pHVar22;
  VkBuffer *pVVar23;
  Allocation *this_00;
  VkDeviceSize offset;
  void *data_06;
  TestLog *pTVar24;
  VkImageSubresourceLayers subresourceLayers;
  VkExtent3D extent;
  allocator<char> local_1149;
  string local_1148;
  undefined4 local_1128;
  allocator<char> local_1121;
  string local_1120;
  ConstPixelBufferAccess local_1100;
  allocator<char> local_10d1;
  string local_10d0;
  allocator<char> local_10a9;
  string local_10a8;
  LogImage local_1088;
  TestLog *local_ff8;
  TestLog *log_1;
  undefined1 local_fe8 [8];
  ConstPixelBufferAccess image;
  Allocation *alloc;
  undefined1 local_fa8 [8];
  VkBufferMemoryBarrier postCopyBarrier;
  undefined1 local_f20 [8];
  VkBufferImageCopy copyRegion;
  undefined1 local_ec8 [8];
  VkImageMemoryBarrier colorAttachmentPreCopyBarrier;
  undefined1 local_e68 [8];
  Vec4 clearColor;
  VkRect2D renderArea;
  undefined1 local_e28 [8];
  VkImageMemoryBarrier colorAttachmentLayoutBarrier;
  Move<vk::Handle<(vk::HandleType)18>_> local_dd0;
  RefData<vk::Handle<(vk::HandleType)18>_> local_db0;
  undefined1 local_d90 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  string local_d68;
  allocator<char> local_d41;
  string local_d40;
  allocator<char> local_d19;
  string local_d18;
  allocator<char> local_cf1;
  string local_cf0;
  allocator<char> local_cc9;
  string local_cc8;
  undefined1 local_ca8 [8];
  GraphicsPipelineBuilder pipelineBuilder;
  Move<vk::VkCommandBuffer_s_*> local_b98;
  RefData<vk::VkCommandBuffer_s_*> local_b78;
  undefined1 local_b58 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_b18;
  undefined1 local_af8 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  RefData<vk::Handle<(vk::HandleType)16>_> local_ab8;
  undefined1 local_a98 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)23>_> local_a68;
  RefData<vk::Handle<(vk::HandleType)23>_> local_a48;
  undefined1 local_a28 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> framebuffer;
  RefData<vk::Handle<(vk::HandleType)17>_> local_9e8;
  undefined1 local_9c8 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  Move<vk::Handle<(vk::HandleType)13>_> local_980;
  RefData<vk::Handle<(vk::HandleType)13>_> local_960;
  undefined1 local_940 [8];
  Unique<vk::Handle<(vk::HandleType)13>_> colorAttachmentView;
  VkBufferCreateInfo local_918;
  undefined1 local_8e0 [8];
  Buffer colorBuffer;
  VkDeviceSize colorBufferSizeBytes;
  VkImageCreateInfo local_898;
  undefined1 local_840 [8];
  Image colorAttachmentImage;
  VkImageSubresourceRange colorImageSubresourceRange;
  VkFormat colorFormat;
  IVec2 renderSize;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  MessageBuilder local_648;
  MessageBuilder local_4c8;
  MessageBuilder local_348;
  MessageBuilder local_1b8;
  TestLog *local_38;
  TestLog *log;
  VkPhysicalDevice physDevice;
  InstanceInterface *vki;
  int expectedPointSize;
  Flags flags_local;
  Context *context_local;
  
  vki._4_4_ = flags;
  _expectedPointSize = context;
  context_local = (Context *)__return_storage_ptr__;
  vki._0_4_ = getExpectedPointSize(flags);
  physDevice = (VkPhysicalDevice)Context::getInstanceInterface(_expectedPointSize);
  log = (TestLog *)Context::getPhysicalDevice(_expectedPointSize);
  requireFeatures((InstanceInterface *)physDevice,(VkPhysicalDevice)log,0x23);
  checkPointSizeRequirements((InstanceInterface *)physDevice,(VkPhysicalDevice)log,(int)vki);
  pTVar10 = Context::getTestContext(_expectedPointSize);
  local_38 = tcu::TestContext::getLog(pTVar10);
  if ((vki._4_4_ & 1) != 0) {
    tcu::TestLog::operator<<(&local_1b8,local_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_1b8,(char (*) [44])"Setting point size in vertex shader to 2.0.");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  }
  if ((vki._4_4_ & 2) != 0) {
    tcu::TestLog::operator<<(&local_348,local_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_348,
                         (char (*) [61])
                         "Setting point size in tessellation evaluation shader to 4.0.");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_348);
  }
  if ((vki._4_4_ & 4) != 0) {
    tcu::TestLog::operator<<(&local_4c8,local_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_4c8,
                         (char (*) [86])
                         "Reading point size in tessellation control shader and adding 2.0 to it in evaluation."
                        );
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4c8);
  }
  if ((vki._4_4_ & 8) != 0) {
    tcu::TestLog::operator<<(&local_648,local_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_648,(char (*) [46])"Setting point size in geometry shader to 6.0.");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_648);
  }
  if ((vki._4_4_ & 0x10) != 0) {
    tcu::TestLog::operator<<
              ((MessageBuilder *)&vk,local_38,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&vk,
                         (char (*) [54])"Reading point size in geometry shader and adding 2.0.");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&vk);
  }
  vk_00 = Context::getDeviceInterface(_expectedPointSize);
  device_00 = Context::getDevice(_expectedPointSize);
  queue_00 = Context::getUniversalQueue(_expectedPointSize);
  dVar5 = Context::getUniversalQueueFamilyIndex(_expectedPointSize);
  allocator_00 = Context::getDefaultAllocator(_expectedPointSize);
  this = &colorImageSubresourceRange.layerCount;
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,0x20,0x20);
  colorImageSubresourceRange.baseArrayLayer = 0x25;
  ::vk::makeImageSubresourceRange
            ((VkImageSubresourceRange *)
             &colorAttachmentImage.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
             ,1,0,1,0,1);
  makeImageCreateInfo(&local_898,(IVec2 *)this,VK_FORMAT_R8G8B8A8_UNORM,0x11,1);
  tessellation::Image::Image
            ((Image *)local_840,vk_00,device_00,allocator_00,&local_898,::vk::MemoryRequirement::Any
            );
  iVar6 = tcu::Vector<int,_2>::x((Vector<int,_2> *)this);
  iVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  colorBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar8 = tcu::getPixelSize((TextureFormat)
                            colorBuffer.m_allocation.
                            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                            m_data._8_8_);
  bufferSize = (VkDeviceSize)(iVar6 * iVar7 * iVar8);
  makeBufferCreateInfo(&local_918,bufferSize,2);
  colorAttachmentView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator.
  _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  tessellation::Buffer::Buffer
            ((Buffer *)local_8e0,vk_00,device_00,allocator_00,&local_918,
             ::vk::MemoryRequirement::HostVisible);
  pVVar12 = tessellation::Image::operator*((Image *)local_840);
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_;
  subresourceRange.levelCount = colorImageSubresourceRange.aspectMask;
  subresourceRange.aspectMask =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_4_;
  subresourceRange.baseMipLevel =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_;
  subresourceRange.baseArrayLayer = colorImageSubresourceRange.baseMipLevel;
  subresourceRange.layerCount = colorImageSubresourceRange.levelCount;
  makeImageView(&local_980,vk_00,device_00,(VkImage)pVVar12->m_internal,VK_IMAGE_VIEW_TYPE_2D,
                VK_FORMAT_R8G8B8A8_UNORM,subresourceRange);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_960,(Move *)&local_980);
  data.deleter.m_deviceIface._0_4_ = (int)local_960.deleter.m_deviceIface;
  data.object.m_internal = local_960.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_960.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_960.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_960.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_960.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_960.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_940,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_980);
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)
                 &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                  m_allocator,vk_00,device_00,VK_FORMAT_R8G8B8A8_UNORM);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_9e8,
             (Move *)&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                      m_allocator);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_9e8.deleter.m_deviceIface;
  data_00.object.m_internal = local_9e8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_9e8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_9e8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_9e8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_9e8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_9e8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_9c8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator)
  ;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_9c8);
  VVar1.m_internal = pHVar13->m_internal;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_940);
  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar14->m_internal;
  dVar9 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  height = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  makeFramebuffer(&local_a68,vk_00,device_00,VVar1,
                  (VkImageView)
                  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                  m_allocator,dVar9,height,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_a48,(Move *)&local_a68);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_a48.deleter.m_deviceIface;
  data_01.object.m_internal = local_a48.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_a48.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_a48.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_a48.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_a48.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_a48.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_a28,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_a68);
  makePipelineLayoutWithoutDescriptors
            ((Move<vk::Handle<(vk::HandleType)16>_> *)
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             vk_00,device_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_ab8,
             (Move *)&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                      m_allocator);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_ab8.deleter.m_deviceIface;
  data_02.object.m_internal = local_ab8.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_ab8.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_ab8.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_ab8.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_ab8.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_ab8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_a98,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                  &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,
                  device_00,dVar5);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_b18,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_b18.deleter.m_deviceIface;
  data_03.object.m_internal = local_b18.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_b18.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_b18.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_b18.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator._0_4_ = (int)local_b18.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_b18.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_af8,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_af8);
  pipelineBuilder._256_8_ = pHVar15->m_internal;
  ::vk::allocateCommandBuffer
            (&local_b98,vk_00,device_00,(VkCommandPool)pipelineBuilder._256_8_,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_b78,(Move *)&local_b98);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_b78.deleter.m_deviceIface;
  data_04.object = local_b78.object;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_b78.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_b78.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_b78.deleter.m_device >> 0x20);
  data_04.deleter.m_pool.m_internal._0_4_ = (int)local_b78.deleter.m_pool.m_internal;
  data_04.deleter.m_pool.m_internal._4_4_ = (int)(local_b78.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_b58,data_04);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_b98);
  GraphicsPipelineBuilder::GraphicsPipelineBuilder((GraphicsPipelineBuilder *)local_ca8);
  pGVar16 = GraphicsPipelineBuilder::setPrimitiveTopology
                      ((GraphicsPipelineBuilder *)local_ca8,VK_PRIMITIVE_TOPOLOGY_POINT_LIST);
  pGVar16 = GraphicsPipelineBuilder::setRenderSize
                      (pGVar16,(IVec2 *)&colorImageSubresourceRange.layerCount);
  pGVar16 = GraphicsPipelineBuilder::setPatchControlPoints(pGVar16,1);
  pPVar17 = Context::getBinaryCollection(_expectedPointSize);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_cc8,"vert",&local_cc9);
  pPVar18 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar17,&local_cc8);
  pGVar16 = GraphicsPipelineBuilder::setShader
                      (pGVar16,vk_00,device_00,VK_SHADER_STAGE_VERTEX_BIT,pPVar18,
                       (VkSpecializationInfo *)0x0);
  pPVar17 = Context::getBinaryCollection(_expectedPointSize);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_cf0,"frag",&local_cf1);
  pPVar18 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar17,&local_cf0);
  GraphicsPipelineBuilder::setShader
            (pGVar16,vk_00,device_00,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar18,
             (VkSpecializationInfo *)0x0);
  std::__cxx11::string::~string((string *)&local_cf0);
  std::allocator<char>::~allocator(&local_cf1);
  std::__cxx11::string::~string((string *)&local_cc8);
  std::allocator<char>::~allocator(&local_cc9);
  bVar4 = isTessellationStage(vki._4_4_);
  if (bVar4) {
    pPVar17 = Context::getBinaryCollection(_expectedPointSize);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d18,"tesc",&local_d19);
    pPVar18 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar17,&local_d18);
    pGVar16 = GraphicsPipelineBuilder::setShader
                        ((GraphicsPipelineBuilder *)local_ca8,vk_00,device_00,
                         VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar18,
                         (VkSpecializationInfo *)0x0);
    pPVar17 = Context::getBinaryCollection(_expectedPointSize);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d40,"tese",&local_d41);
    pPVar18 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar17,&local_d40);
    GraphicsPipelineBuilder::setShader
              (pGVar16,vk_00,device_00,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar18,
               (VkSpecializationInfo *)0x0);
    std::__cxx11::string::~string((string *)&local_d40);
    std::allocator<char>::~allocator(&local_d41);
    std::__cxx11::string::~string((string *)&local_d18);
    std::allocator<char>::~allocator(&local_d19);
  }
  bVar4 = isGeometryStage(vki._4_4_);
  if (bVar4) {
    pPVar17 = Context::getBinaryCollection(_expectedPointSize);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d68,"geom",
               (allocator<char> *)
               ((long)&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                       m_allocator + 7));
    pPVar18 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar17,&local_d68);
    GraphicsPipelineBuilder::setShader
              ((GraphicsPipelineBuilder *)local_ca8,vk_00,device_00,VK_SHADER_STAGE_GEOMETRY_BIT,
               pPVar18,(VkSpecializationInfo *)0x0);
    std::__cxx11::string::~string((string *)&local_d68);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                       m_allocator + 7));
  }
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_a98);
  pipelineLayout_00.m_internal = pHVar19->m_internal;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_9c8);
  colorAttachmentLayoutBarrier._64_8_ = pHVar13->m_internal;
  GraphicsPipelineBuilder::build
            (&local_dd0,(GraphicsPipelineBuilder *)local_ca8,vk_00,device_00,pipelineLayout_00,
             (VkRenderPass)colorAttachmentLayoutBarrier._64_8_);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_db0,(Move *)&local_dd0);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_db0.deleter.m_deviceIface;
  data_05.object.m_internal = local_db0.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_db0.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_db0.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_db0.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator._0_4_ = (int)local_db0.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_db0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_d90,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_dd0);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_b58);
  beginCommandBuffer(vk_00,*ppVVar20);
  pVVar12 = tessellation::Image::operator*((Image *)local_840);
  subresourceRange_00.levelCount = colorImageSubresourceRange.aspectMask;
  subresourceRange_00.aspectMask =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_4_;
  subresourceRange_00.baseMipLevel =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_;
  subresourceRange_00.baseArrayLayer = colorImageSubresourceRange.baseMipLevel;
  subresourceRange_00.layerCount = colorImageSubresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_e28,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,(VkImage)pVVar12->m_internal,
             subresourceRange_00);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_b58);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar20,1,0x80,0,0,0,0,0,1,local_e28);
  clearColor.m_data._8_8_ = ::vk::makeOffset2D(0,0);
  dVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  dVar9 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  ::vk::makeExtent2D(dVar5,dVar9);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_e68,0.0,0.0,0.0,1.0);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_b58);
  commandBuffer = *ppVVar20;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_9c8);
  VVar1.m_internal = pHVar13->m_internal;
  pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_a28);
  beginRenderPass(vk_00,commandBuffer,VVar1,(VkFramebuffer)pHVar21->m_internal,
                  (VkRect2D *)(clearColor.m_data + 2),(Vec4 *)local_e68);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_b58);
  pVVar2 = *ppVVar20;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_d90);
  colorAttachmentPreCopyBarrier._64_8_ = pHVar22->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar2,0,colorAttachmentPreCopyBarrier._64_8_);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_b58);
  (*vk_00->_vptr_DeviceInterface[0x59])(vk_00,*ppVVar20,1,1,0);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_b58);
  endRenderPass(vk_00,*ppVVar20);
  pVVar12 = tessellation::Image::operator*((Image *)local_840);
  copyRegion.imageExtent.height =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_4_;
  copyRegion.imageExtent.depth =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_;
  subresourceRange_01.levelCount = colorImageSubresourceRange.aspectMask;
  subresourceRange_01.aspectMask =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_4_;
  subresourceRange_01.baseMipLevel =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_;
  subresourceRange_01.baseArrayLayer = colorImageSubresourceRange.baseMipLevel;
  subresourceRange_01.layerCount = colorImageSubresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_ec8,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,(VkImage)pVVar12->m_internal,subresourceRange_01);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_b58);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar20,0x400,0x1000,0,0,0,0,0,1,local_ec8);
  dVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  dVar9 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  extent = ::vk::makeExtent3D(dVar5,dVar9,1);
  subresourceLayers = ::vk::makeImageSubresourceLayers(1,0,0,1);
  makeBufferImageCopy((VkBufferImageCopy *)local_f20,extent,subresourceLayers);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_b58);
  pVVar2 = *ppVVar20;
  pVVar12 = tessellation::Image::operator*((Image *)local_840);
  dVar3 = pVVar12->m_internal;
  pVVar23 = tessellation::Buffer::operator*((Buffer *)local_8e0);
  postCopyBarrier.size = pVVar23->m_internal;
  (*vk_00->_vptr_DeviceInterface[99])(vk_00,pVVar2,dVar3,6,postCopyBarrier.size,1,(int)local_f20);
  pVVar23 = tessellation::Buffer::operator*((Buffer *)local_8e0);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_fa8,0x1000,0x2000,(VkBuffer)pVVar23->m_internal,0,
             bufferSize);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_b58);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar20,0x1000,0x4000,0,0,0,1,(int)local_fa8,0,0);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_b58);
  endCommandBuffer(vk_00,*ppVVar20);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_b58);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar20);
  this_00 = tessellation::Buffer::getAllocation((Buffer *)local_8e0);
  image.m_data = (void *)::vk::Allocation::getMemory(this_00);
  offset = ::vk::Allocation::getOffset(this_00);
  ::vk::invalidateMappedMemoryRange(vk_00,device_00,(VkDeviceMemory)image.m_data,offset,bufferSize);
  log_1 = (TestLog *)::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar6 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  iVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  data_06 = ::vk::Allocation::getHostPtr(this_00);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_fe8,(TextureFormat *)&log_1,iVar6,iVar7,1,data_06);
  pTVar10 = Context::getTestContext(_expectedPointSize);
  pTVar24 = tcu::TestContext::getLog(pTVar10);
  local_ff8 = pTVar24;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10a8,"color0",&local_10a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10d0,"",&local_10d1);
  tcu::LogImage::LogImage
            (&local_1088,&local_10a8,&local_10d0,(ConstPixelBufferAccess *)local_fe8,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar24,&local_1088);
  tcu::LogImage::~LogImage(&local_1088);
  std::__cxx11::string::~string((string *)&local_10d0);
  std::allocator<char>::~allocator(&local_10d1);
  std::__cxx11::string::~string((string *)&local_10a8);
  std::allocator<char>::~allocator(&local_10a9);
  pTVar24 = local_ff8;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_1100,(ConstPixelBufferAccess *)local_fe8);
  bVar4 = verifyImage(pTVar24,&local_1100,(int)vki);
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1120,"OK",&local_1121);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_1120);
    std::__cxx11::string::~string((string *)&local_1120);
    std::allocator<char>::~allocator(&local_1121);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1148,"Didn\'t render expected point",&local_1149);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_1148);
    std::__cxx11::string::~string((string *)&local_1148);
    std::allocator<char>::~allocator(&local_1149);
  }
  local_1128 = 1;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_d90);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)local_ca8);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_b58);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_af8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_a98);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_a28);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_9c8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_940);
  tessellation::Buffer::~Buffer((Buffer *)local_8e0);
  tessellation::Image::~Image((Image *)local_840);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const Flags flags)
{
	const int expectedPointSize = getExpectedPointSize(flags);
	{
		const InstanceInterface& vki        = context.getInstanceInterface();
		const VkPhysicalDevice   physDevice = context.getPhysicalDevice();

		requireFeatures           (vki, physDevice, FEATURE_TESSELLATION_SHADER | FEATURE_GEOMETRY_SHADER | FEATURE_SHADER_TESSELLATION_AND_GEOMETRY_POINT_SIZE);
		checkPointSizeRequirements(vki, physDevice, expectedPointSize);
	}
	{
		tcu::TestLog& log = context.getTestContext().getLog();

		if (flags & FLAG_VERTEX_SET)
			log << tcu::TestLog::Message << "Setting point size in vertex shader to 2.0." << tcu::TestLog::EndMessage;
		if (flags & FLAG_TESSELLATION_EVALUATION_SET)
			log << tcu::TestLog::Message << "Setting point size in tessellation evaluation shader to 4.0." << tcu::TestLog::EndMessage;
		if (flags & FLAG_TESSELLATION_ADD)
			log << tcu::TestLog::Message << "Reading point size in tessellation control shader and adding 2.0 to it in evaluation." << tcu::TestLog::EndMessage;
		if (flags & FLAG_GEOMETRY_SET)
			log << tcu::TestLog::Message << "Setting point size in geometry shader to 6.0." << tcu::TestLog::EndMessage;
		if (flags & FLAG_GEOMETRY_ADD)
			log << tcu::TestLog::Message << "Reading point size in geometry shader and adding 2.0." << tcu::TestLog::EndMessage;
	}

	const DeviceInterface&	vk					= context.getDeviceInterface();
	const VkDevice			device				= context.getDevice();
	const VkQueue			queue				= context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= context.getDefaultAllocator();

	// Color attachment

	const tcu::IVec2			  renderSize				 = tcu::IVec2(RENDER_SIZE, RENDER_SIZE);
	const VkFormat				  colorFormat				 = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Image					  colorAttachmentImage		 (vk, device, allocator,
															 makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 1u),
															 MemoryRequirement::Any);

	// Color output buffer

	const VkDeviceSize	colorBufferSizeBytes = renderSize.x()*renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer		colorBuffer          (vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Pipeline

	const Unique<VkImageView>		colorAttachmentView(makeImageView						(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorImageSubresourceRange));
	const Unique<VkRenderPass>		renderPass		   (makeRenderPass						(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer		   (makeFramebuffer						(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), 1u));
	const Unique<VkPipelineLayout>	pipelineLayout	   (makePipelineLayoutWithoutDescriptors(vk, device));
	const Unique<VkCommandPool>		cmdPool			   (makeCommandPool						(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		   (allocateCommandBuffer				(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	GraphicsPipelineBuilder			pipelineBuilder;

	pipelineBuilder
		.setPrimitiveTopology		  (VK_PRIMITIVE_TOPOLOGY_POINT_LIST)
		.setRenderSize				  (renderSize)
		.setPatchControlPoints		  (1)
		.setShader					  (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader					  (vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				context.getBinaryCollection().get("frag"), DE_NULL);

	if (isTessellationStage(flags))
		pipelineBuilder
			.setShader				  (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	context.getBinaryCollection().get("tesc"), DE_NULL)
			.setShader				  (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, context.getBinaryCollection().get("tese"), DE_NULL);

	if (isGeometryStage(flags))
		pipelineBuilder
			.setShader				  (vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,				context.getBinaryCollection().get("geom"), DE_NULL);

	const Unique<VkPipeline> pipeline(pipelineBuilder.build(vk, device, *pipelineLayout, *renderPass));

	// Draw commands

	beginCommandBuffer(vk, *cmdBuffer);

	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	// Begin render pass
	{
		const VkRect2D renderArea = {
			makeOffset2D(0, 0),
			makeExtent2D(renderSize.x(), renderSize.y()),
		};
		const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);

		beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);

	vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}
	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results
	{
		const Allocation& alloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), colorBufferSizeBytes);
		tcu::ConstPixelBufferAccess image(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1, alloc.getHostPtr());

		tcu::TestLog& log = context.getTestContext().getLog();
		log << tcu::LogImage("color0", "", image);

		if (verifyImage(log, image, expectedPointSize))
			return tcu::TestStatus::pass("OK");
		else
			return tcu::TestStatus::fail("Didn't render expected point");
	}
}